

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O0

void __thiscall FM::OPNBase::SetParameter(OPNBase *this,Channel4 *ch,uint addr,uint data)

{
  Operator *this_00;
  bool local_41;
  Operator *op;
  uint slot;
  uint data_local;
  uint addr_local;
  Channel4 *ch_local;
  OPNBase *this_local;
  
  if ((addr & 3) < 3) {
    this_00 = ch->op + *(uint *)((long)SetParameter::slottable + (ulong)(addr & 0xc));
    switch(addr >> 4 & 0xf) {
    case 3:
      Operator::SetDT(this_00,data >> 4 & 7);
      Operator::SetMULTI(this_00,data & 0xf);
      break;
    case 4:
      local_41 = false;
      if (((this->super_Timer).regtc & 0x80) != 0) {
        local_41 = this->csmch == ch;
      }
      Operator::SetTL(this_00,data & 0x7f,local_41);
      break;
    case 5:
      Operator::SetKS(this_00,data >> 6 & 3);
      Operator::SetAR(this_00,(data & 0x1f) << 1);
      break;
    case 6:
      Operator::SetDR(this_00,(data & 0x1f) << 1);
      Operator::SetAMON(this_00,(data & 0x80) != 0);
      break;
    case 7:
      Operator::SetSR(this_00,(data & 0x1f) << 1);
      break;
    case 8:
      Operator::SetSL(this_00,(uint)""[data >> 4 & 0xf]);
      Operator::SetRR(this_00,(data & 0xf) * 4 + 2);
      break;
    case 9:
      Operator::SetSSGEC(this_00,data & 0xf);
    }
  }
  return;
}

Assistant:

void OPNBase::SetParameter(Channel4* ch, uint addr, uint data)
{
	const static uint slottable[4] = { 0, 2, 1, 3 };
	const static uint8 sltable[16] =
	{
		  0,   4,   8,  12,  16,  20,  24,  28,
		 32,  36,  40,  44,  48,  52,  56, 124,
	};

	if ((addr & 3) < 3)
	{
		uint slot = slottable[(addr >> 2) & 3];
		Operator* op = &ch->op[slot];

		switch ((addr >> 4) & 15)
		{
		case 3:	// 30-3E DT/MULTI
			op->SetDT((data >> 4) & 0x07);
			op->SetMULTI(data & 0x0f);
			break;

		case 4: // 40-4E TL
			op->SetTL(data & 0x7f, (regtc & 0x80) && (csmch == ch));
			break;

		case 5: // 50-5E KS/AR
			op->SetKS((data >> 6) & 3);
			op->SetAR((data & 0x1f) * 2);
			break;

		case 6: // 60-6E DR/AMON
			op->SetDR((data & 0x1f) * 2);
			op->SetAMON((data & 0x80) != 0);
			break;

		case 7: // 70-7E SR
			op->SetSR((data & 0x1f) * 2);
			break;

		case 8:	// 80-8E SL/RR
			op->SetSL(sltable[(data >> 4) & 15]);
			op->SetRR((data & 0x0f) * 4 + 2);
			break;

		case 9: // 90-9E SSG-EC
			op->SetSSGEC(data & 0x0f);
			break;
		}
	}
}